

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O0

void __thiscall GibbsSamplerFromHDP::deleteK(GibbsSamplerFromHDP *this,uint k)

{
  uint uVar1;
  reference pvVar2;
  reference pvVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  const_iterator local_68;
  uint *local_60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  const_iterator local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_38;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_30;
  const_iterator local_28;
  uint local_1c;
  uint local_18;
  int t;
  int j;
  uint k_local;
  GibbsSamplerFromHDP *this_local;
  
  t = k;
  _j = this;
  for (local_18 = 0; local_18 < this->_J; local_18 = local_18 + 1) {
    local_1c = 0;
    while( true ) {
      uVar1 = local_1c;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_Tj,(long)(int)local_18);
      if (*pvVar2 <= uVar1) break;
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_kjt,(long)(int)local_18);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(long)(int)local_1c);
      if ((uint)t < *pvVar2) {
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](&this->_kjt,(long)(int)local_18);
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar3,(long)(int)local_1c);
        *pvVar2 = *pvVar2 - 1;
      }
      local_1c = local_1c + 1;
    }
  }
  local_38._M_current =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       std::
       vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ::begin(&this->_nkv);
  local_30 = __gnu_cxx::
             __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator+(&local_38,(ulong)(uint)t);
  __gnu_cxx::
  __normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
  ::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
            ((__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
              *)&local_28,&local_30);
  local_40 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::erase(&this->_nkv,local_28);
  local_58._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_nk);
  local_50 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_58,(ulong)(uint)t);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_48,&local_50);
  local_60 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                               (&this->_nk,local_48);
  local_78._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_mk);
  local_70 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_78,(ulong)(uint)t);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_68,&local_70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase(&this->_mk,local_68);
  this->_K = this->_K - 1;
  return;
}

Assistant:

void GibbsSamplerFromHDP::deleteK(unsigned int k){//{{{
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            if(_kjt[j][t] > k) _kjt[j][t]--;
        }
    }
    _nkv.erase(_nkv.begin() + k);
    _nk.erase(_nk.begin() + k);
    _mk.erase(_mk.begin() + k);
    _K--;
}